

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::LogTickIterator::GetNextTick
          (LogTickIterator *this,float *outTick,bool *outIsMajorTick,string *outFormatString)

{
  int iVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  char local_c8 [8];
  char theBuf [128];
  int thePowNow;
  float theLogNow;
  float theLogFac;
  float theBase;
  string *outFormatString_local;
  bool *outIsMajorTick_local;
  float *outTick_local;
  LogTickIterator *this_local;
  
  if ((this->super_TickIterator).mAxisSetup == (AxisSetup *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->mCurrentTick <= ((this->super_TickIterator).mAxisSetup)->mMax * 1.0001) {
    *outTick = this->mCurrentTick;
    *outIsMajorTick =
         this->mCount % (long)(((this->super_TickIterator).mAxisSetup)->mTickInfo).mTickDivision ==
         0;
    TickInfo::MakeFormatString(*outTick,outFormatString);
    fVar3 = ((this->super_TickIterator).mAxisSetup)->mLogBase;
    fVar2 = SafeLog(this->mCurrentTick,fVar3,1.0);
    dVar4 = std::floor((double)(ulong)(uint)fVar2);
    iVar1 = (int)SUB84(dVar4,0);
    *outIsMajorTick = false;
    dVar4 = std::fabs((double)(ulong)(uint)(fVar2 - (float)iVar1));
    if (SUB84(dVar4,0) < 0.0001) {
      *outIsMajorTick = true;
    }
    if (1 < ((this->super_TickIterator).mAxisSetup)->mLogFactor) {
      snprintf(local_c8,0x80,"%d",(ulong)(uint)(iVar1 * 0x14));
      std::__cxx11::string::operator=((string *)outFormatString,local_c8);
    }
    fVar2 = this->mDelta;
    fVar3 = SafeExp((float)iVar1,fVar3,1.0);
    this->mCurrentTick = fVar2 * fVar3 + this->mCurrentTick;
    this->mCount = this->mCount + 1;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LogTickIterator::GetNextTick (float &outTick, bool &outIsMajorTick, string &outFormatString) {
      if (!mAxisSetup) {
        return false;
      }
      if (mCurrentTick>mAxisSetup->mMax*kLittleIncrease) {
        return false;
      }
      outTick = mCurrentTick;
      outIsMajorTick = (mCount%mAxisSetup->mTickInfo.mTickDivision == 0);
      TickInfo::MakeFormatString (outTick, outFormatString);
      float theBase = mAxisSetup->mLogBase;
      float theLogFac = 1;//mAxisSetup->mLogFactor;
      float theLogNow = SafeLog(mCurrentTick, theBase, theLogFac);
      int thePowNow = (int)floor(theLogNow);
      outIsMajorTick = false;
      if (fabs (theLogNow-thePowNow)<kEps) {
        outIsMajorTick = true;
      }

      if (mAxisSetup->mLogFactor>1) {
        char theBuf[128];
        snprintf (theBuf, 128, "%d", thePowNow*20);
        outFormatString = theBuf;
      }

      mCurrentTick += mDelta*SafeExp (thePowNow, theBase, theLogFac);
      mCount++;

      return true;
    }